

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
            *this,uint numberOfColumns,Column_settings *colSettings)

{
  __hashtable *__this;
  ulong __bkt_count_hint;
  allocator_type local_36;
  key_equal local_35;
  hash<unsigned_int> local_34;
  allocator_type local_33;
  key_equal local_32;
  hash<unsigned_int> local_31;
  
  (this->super_RU_pairing_option).super_type.map_._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->super_RU_pairing_option).super_type.map_._M_h._M_rehash_policy = 0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_element_count = 0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_buckets =
       &(this->super_RU_pairing_option).super_type.map_._M_h._M_single_bucket;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_bucket_count = 1;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_RU_pairing_option).barcode_.
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RU_pairing_option).barcode_.
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RU_pairing_option).barcode_.
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RU_pairing_option).indexToBar_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_RU_pairing_option).indexToBar_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_RU_pairing_option).indexToBar_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_RU_pairing_option).super_type.map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_buckets =
       &(this->super_RU_pairing_option).idToPosition_._M_h._M_single_bucket;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_bucket_count = 1;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
  ;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_element_count = 0;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  __bkt_count_hint = (ulong)numberOfColumns;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_RU_pairing_option).idToPosition_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&this->reducedMatrixR_,__bkt_count_hint,&local_34,&local_35,&local_36);
  (this->reducedMatrixR_).nextInsertIndex_ = 0;
  (this->reducedMatrixR_).colSettings_ = colSettings;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&this->mirrorMatrixU_,__bkt_count_hint,&local_31,&local_32,&local_33);
  (this->mirrorMatrixU_).nextInsertIndex_ = 0;
  (this->mirrorMatrixU_).colSettings_ = colSettings;
  (this->pivotToColumnIndex_)._M_h._M_buckets = &(this->pivotToColumnIndex_)._M_h._M_single_bucket;
  (this->pivotToColumnIndex_)._M_h._M_bucket_count = 1;
  (this->pivotToColumnIndex_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pivotToColumnIndex_)._M_h._M_element_count = 0;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pivotToColumnIndex_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->nextEventIndex_ = 0;
  this->operators_ = &colSettings->operators;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->pivotToColumnIndex_)._M_h,__bkt_count_hint);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&(this->super_RU_pairing_option).indexToBar_,__bkt_count_hint);
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(unsigned int numberOfColumns, Column_settings* colSettings)
    : Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      reducedMatrixR_(numberOfColumns, colSettings),
      mirrorMatrixU_(numberOfColumns, colSettings),
      nextEventIndex_(0),
      operators_(nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(numberOfColumns);
  } else {
    pivotToColumnIndex_.resize(numberOfColumns, Master_matrix::template get_null_value<Index>());
  }
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(numberOfColumns);
  }
  if constexpr (Master_matrix::Option_list::has_vine_update) {
    Swap_opt::_positionToRowIdx().reserve(numberOfColumns);
  }
}